

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::transform
          (LightNodeImpl<embree::SceneGraph::QuadLight> *this,AffineSpace3fa *space)

{
  LightNodeImpl<embree::SceneGraph::QuadLight> *this_00;
  AffineSpace3fa *in_RDX;
  QuadLight QStack_88;
  
  this_00 = (LightNodeImpl<embree::SceneGraph::QuadLight> *)operator_new(0xd0);
  QuadLight::transform((QuadLight *)&space[1].p,in_RDX);
  LightNodeImpl(this_00,&QStack_88);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> transform(const AffineSpace3fa& space) const {
        return new LightNodeImpl(light.transform(space));
      }